

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

void __thiscall Triangle::Triangle(Triangle *this,mat4 *ltw,vec3 *v0,vec3 *v1,vec3 *v2,ColorRGB c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  
  ColorRGB::ColorRGB(&this->color);
  *(undefined8 *)((long)&(this->e0).field_0 + 4) = 0;
  *(undefined8 *)&(this->v1).field_0 = 0;
  *(undefined8 *)&(this->v0).field_0 = 0;
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->n).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->e1).field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->e2).field_0 + 4) = 0;
  *(undefined8 *)&(this->n).field_0 = 0;
  *(undefined8 *)&(this->v2).field_0 = 0;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = 0;
  (this->v1).field_0.field_0.z = 0.0;
  fVar1 = (v0->field_0).field_0.x;
  fVar2 = (v0->field_0).field_0.y;
  fVar3 = (v0->field_0).field_0.z;
  fVar4 = ltw->value[1].field_0.field_0.z;
  fVar5 = ltw->value[0].field_0.field_0.z;
  fVar6 = ltw->value[2].field_0.field_0.z;
  fVar7 = ltw->value[3].field_0.field_0.z;
  uVar8 = *(undefined8 *)&ltw->value[0].field_0;
  uVar9 = *(undefined8 *)&ltw->value[1].field_0;
  uVar10 = *(undefined8 *)&ltw->value[2].field_0;
  uVar11 = *(undefined8 *)&ltw->value[3].field_0;
  *(ulong *)&(this->v0).field_0 =
       CONCAT44(fVar3 * (float)((ulong)uVar10 >> 0x20) +
                fVar1 * (float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar9 >> 0x20) * fVar2 +
                (float)((ulong)uVar11 >> 0x20),
                fVar3 * (float)uVar10 + fVar1 * (float)uVar8 + (float)uVar9 * fVar2 + (float)uVar11)
  ;
  (this->v0).field_0.field_0.z = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  fVar1 = (v1->field_0).field_0.x;
  fVar2 = (v1->field_0).field_0.y;
  fVar3 = (v1->field_0).field_0.z;
  fVar4 = ltw->value[1].field_0.field_0.z;
  fVar5 = ltw->value[0].field_0.field_0.z;
  fVar6 = ltw->value[2].field_0.field_0.z;
  fVar7 = ltw->value[3].field_0.field_0.z;
  uVar8 = *(undefined8 *)&ltw->value[0].field_0;
  uVar9 = *(undefined8 *)&ltw->value[1].field_0;
  uVar10 = *(undefined8 *)&ltw->value[2].field_0;
  uVar11 = *(undefined8 *)&ltw->value[3].field_0;
  *(ulong *)&(this->v1).field_0 =
       CONCAT44(fVar3 * (float)((ulong)uVar10 >> 0x20) +
                fVar1 * (float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar9 >> 0x20) * fVar2 +
                (float)((ulong)uVar11 >> 0x20),
                fVar3 * (float)uVar10 + fVar1 * (float)uVar8 + (float)uVar9 * fVar2 + (float)uVar11)
  ;
  (this->v1).field_0.field_0.z = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  fVar1 = (v2->field_0).field_0.x;
  fVar2 = (v2->field_0).field_0.y;
  fVar3 = (v2->field_0).field_0.z;
  fVar4 = ltw->value[1].field_0.field_0.z;
  fVar5 = ltw->value[0].field_0.field_0.z;
  fVar6 = ltw->value[2].field_0.field_0.z;
  fVar7 = ltw->value[3].field_0.field_0.z;
  uVar8 = *(undefined8 *)&ltw->value[0].field_0;
  uVar9 = *(undefined8 *)&ltw->value[1].field_0;
  uVar10 = *(undefined8 *)&ltw->value[2].field_0;
  uVar11 = *(undefined8 *)&ltw->value[3].field_0;
  *(ulong *)&(this->v2).field_0 =
       CONCAT44(fVar3 * (float)((ulong)uVar10 >> 0x20) +
                fVar1 * (float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar9 >> 0x20) * fVar2 +
                (float)((ulong)uVar11 >> 0x20),
                fVar3 * (float)uVar10 + fVar1 * (float)uVar8 + (float)uVar9 * fVar2 + (float)uVar11)
  ;
  (this->v2).field_0.field_0.z = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  _calculateNormal(this);
  _calculateEdges(this);
  return;
}

Assistant:

Triangle::Triangle(
    const glm::mat4 &ltw,
    glm::vec3 v0,
    glm::vec3 v1,
    glm::vec3 v2,
    ColorRGB c) {
    
    this->v0 = glm::vec3(ltw * glm::vec4(v0, 1));
    this->v1 = glm::vec3(ltw * glm::vec4(v1, 1));
    this->v2 = glm::vec3(ltw * glm::vec4(v2, 1));
    
    color = c;
    
//     std::cout << "v0: (" << this->v0.x << ", " << this->v0.y << ", " << this->v0.z << ") ";
//     std::cout << "v1: (" << this->v1.x << ", " << this->v1.y << ", " << this->v1.z << ") ";
//     std::cout << "v2: (" << this->v2.x << ", " << this->v2.y << ", " << this->v2.z << ") ";
  
    _calculateNormal();
    _calculateEdges();
}